

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_server_key_exchange(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  mbedtls_key_exchange_type_t mVar2;
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_x509_crt *pmVar3;
  mbedtls_md_type_t md_alg_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  mbedtls_pk_type_t mVar7;
  mbedtls_pk_type_t mVar8;
  uchar message;
  ulong uVar9;
  uchar *puVar10;
  size_t hash_len;
  uchar *end;
  mbedtls_md_type_t md_alg;
  uchar hash [64];
  ushort *local_98;
  mbedtls_md_type_t local_90;
  mbedtls_pk_type_t local_8c;
  uchar *local_88;
  ushort *local_80;
  uchar local_78 [72];
  
  info = ssl->transform_negotiate->ciphersuite_info;
  if (info->key_exchange - MBEDTLS_KEY_EXCHANGE_ECDH_RSA < 2) {
    pmVar3 = ssl->session_negotiate->peer_cert;
    if (pmVar3 == (mbedtls_x509_crt *)0x0) {
      iVar4 = -0x7700;
    }
    else {
      iVar4 = mbedtls_pk_can_do(&pmVar3->pk,MBEDTLS_PK_ECKEY);
      if (iVar4 == 0) {
        iVar4 = -0x6d00;
      }
      else {
        iVar4 = mbedtls_ecdhopt_use_static_key
                          (&ssl->handshake->ecdh_ctx,
                           (mbedtls_ecp_keypair *)(ssl->session_negotiate->peer_cert->pk).pk_ctx,
                           MBEDTLS_ECDH_THEIRS);
        if (iVar4 == 0) {
          iVar5 = ssl_check_server_ecdh_params(ssl);
          iVar4 = -0x7a00;
          if (iVar5 == 0) goto LAB_001191db;
        }
      }
    }
    message = '(';
    goto LAB_001192c2;
  }
  if (info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA) {
LAB_001191db:
    ssl->state = ssl->state + 1;
    iVar4 = 0;
  }
  else {
    iVar4 = mbedtls_ssl_read_record(ssl);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (ssl->in_msgtype == 0x16) {
      puVar10 = ssl->in_msg;
      if (*puVar10 == '\f') {
        uVar6 = *(uint *)&ssl->conf->field_0x174 & 2;
        local_98 = (ushort *)(puVar10 + (ulong)uVar6 * 4 + 4);
        end = puVar10 + ssl->in_hslen;
        mVar2 = info->key_exchange;
        if (mVar2 - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
          if (end + -2 < local_98) goto LAB_00119332;
          uVar9 = (ulong)(ushort)(*local_98 << 8 | *local_98 >> 8);
          if (end + -uVar9 < puVar10 + (ulong)uVar6 * 4 + 6) goto LAB_00119332;
          local_98 = (ushort *)(puVar10 + (ulong)uVar6 * 4 + 6 + uVar9);
        }
        if (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK < mVar2) {
          return -0x6c00;
        }
        if ((0x118U >> (mVar2 & 0x1f) & 1) == 0) {
          if ((0x44U >> (mVar2 & 0x1f) & 1) != 0) {
            iVar4 = ssl_parse_server_dh_params(ssl,(uchar **)&local_98,end);
            goto LAB_0011932e;
          }
          if ((0xa0U >> (mVar2 & 0x1f) & 1) == 0) {
            return -0x6c00;
          }
        }
        else {
          iVar4 = ssl_parse_server_ecdh_params(ssl,(uchar **)&local_98,end);
LAB_0011932e:
          if (iVar4 != 0) {
LAB_00119332:
            mbedtls_ssl_send_alert_message(ssl,'\x02','/');
            return -0x7b00;
          }
        }
        if (0xfffffffc < info->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK) {
          local_90 = MBEDTLS_MD_NONE;
          local_8c = MBEDTLS_PK_NONE;
          puVar10 = ssl->in_msg;
          bVar1 = ssl->conf->field_0x174;
          if (ssl->minor_ver == 3) {
            local_80 = local_98;
            iVar5 = ssl_parse_signature_algorithm(ssl,(uchar **)&local_98,end,&local_90,&local_8c);
            mVar8 = local_8c;
            iVar4 = -0x7b00;
            message = '/';
            if ((iVar5 != 0) ||
               (local_88 = puVar10, mVar7 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info),
               puVar10 = local_88, mVar8 != mVar7)) goto LAB_001192c2;
          }
          else {
            if (2 < ssl->minor_ver) {
              return -0x6c00;
            }
            local_80 = local_98;
            mVar8 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
            if (mVar8 == MBEDTLS_PK_ECDSA) {
              local_90 = MBEDTLS_MD_SHA1;
              mVar8 = MBEDTLS_PK_ECDSA;
            }
          }
          md_alg_00 = local_90;
          iVar4 = -0x7b00;
          message = '2';
          if (end + -2 < local_98) {
LAB_001192c2:
            mbedtls_ssl_send_alert_message(ssl,'\x02',message);
            return iVar4;
          }
          uVar9 = (ulong)(ushort)(*local_98 << 8 | *local_98 >> 8);
          local_98 = local_98 + 1;
          if (local_98 != (ushort *)(end + -uVar9)) goto LAB_001192c2;
          local_88 = (uchar *)CONCAT44(local_88._4_4_,mVar8);
          puVar10 = puVar10 + (ulong)((bVar1 & 2) >> 1) * 8 + 4;
          if (local_90 == MBEDTLS_MD_NONE) {
            iVar4 = mbedtls_ssl_get_key_exchange_md_ssl_tls
                              (ssl,local_78,puVar10,(long)local_80 - (long)puVar10);
            if (iVar4 != 0) {
              return iVar4;
            }
            hash_len = 0x24;
          }
          else {
            iVar4 = mbedtls_ssl_get_key_exchange_md_tls1_2
                              (ssl,local_78,puVar10,(long)local_80 - (long)puVar10,local_90);
            if (iVar4 != 0) {
              return iVar4;
            }
            hash_len = 0;
          }
          pmVar3 = ssl->session_negotiate->peer_cert;
          message = '(';
          if (pmVar3 == (mbedtls_x509_crt *)0x0) {
            iVar4 = -0x7700;
            goto LAB_001192c2;
          }
          iVar4 = mbedtls_pk_can_do(&pmVar3->pk,(mbedtls_pk_type_t)local_88);
          if (iVar4 == 0) {
            iVar4 = -0x6d00;
            goto LAB_001192c2;
          }
          iVar4 = mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,md_alg_00,local_78,
                                    hash_len,(uchar *)local_98,uVar9);
          if (iVar4 != 0) {
            message = '3';
            goto LAB_001192c2;
          }
        }
        goto LAB_001191db;
      }
      if ((info->key_exchange | MBEDTLS_KEY_EXCHANGE_DHE_RSA) == MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
        ssl->keep_current_message = 1;
        goto LAB_001191db;
      }
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
    iVar4 = -0x7700;
  }
  return iVar4;
}

Assistant:

static int ssl_parse_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
        ssl->transform_negotiate->ciphersuite_info;
    unsigned char *p = NULL, *end = NULL;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        if( ( ret = ssl_get_ecdh_params_from_cert( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_get_ecdh_params_from_cert", ret );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif /* MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * ServerKeyExchange may be skipped with PSK and RSA-PSK when the server
     * doesn't use a psk_identity_hint
     */
    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE )
    {
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
            ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        {
            /* Current message is probably either
             * CertificateRequest or ServerHelloDone */
            ssl->keep_current_message = 1;
            goto exit;
        }

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server key exchange message must "
                                    "not be skipped" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );

        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    p   = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    end = ssl->in_msg + ssl->in_hslen;
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server key exchange", p, end - p );

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        if( ssl_parse_server_psk_hint( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    } /* FALLTROUGH */
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        ; /* nothing more to do */
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl_parse_server_dh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        if( ssl_parse_server_ecdh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        ret = mbedtls_ecjpake_read_round_two( &ssl->handshake->ecjpake_ctx,
                                              p, end - p );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_read_round_two", ret );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED)
    if( mbedtls_ssl_ciphersuite_uses_server_signature( ciphersuite_info ) )
    {
        size_t sig_len, hashlen;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
        mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
        unsigned char *params = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
        size_t params_len = p - params;

        /*
         * Handle the digitally-signed structure
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            if( ssl_parse_signature_algorithm( ssl, &p, end,
                                               &md_alg, &pk_alg ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                                MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }

            if( pk_alg != mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                                MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            pk_alg = mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info );

            /* Default hash for ECDSA is SHA-1 */
            if( pk_alg == MBEDTLS_PK_ECDSA && md_alg == MBEDTLS_MD_NONE )
                md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Read signature
         */

        if( p > end - 2 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
        sig_len = ( p[0] << 8 ) | p[1];
        p += 2;

        if( p != end - sig_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "signature", p, sig_len );

        /*
         * Compute the hash that has been signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            hashlen = 36;
            ret = mbedtls_ssl_get_key_exchange_md_ssl_tls( ssl, hash, params,
                                                           params_len );
            if( ret != 0 )
                return( ret );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            /* Info from md_alg will be used instead */
            hashlen = 0;
            ret = mbedtls_ssl_get_key_exchange_md_tls1_2( ssl, hash, params,
                                                          params_len, md_alg );
            if( ret != 0 )
                return( ret );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        if( ssl->session_negotiate->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        /*
         * Verify signature
         */
        if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
            return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
        }

        if( ( ret = mbedtls_pk_verify( &ssl->session_negotiate->peer_cert->pk,
                               md_alg, hash, hashlen, p, sig_len ) ) != 0 )
        {
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECRYPT_ERROR );
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_verify", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_KEY_EXCHANGE__WITH_SERVER_SIGNATURE__ENABLED */

exit:
    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server key exchange" ) );

    return( 0 );
}